

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::DescriptorProto::~DescriptorProto(DescriptorProto *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DescriptorProto_0028fc00;
  SharedDtor(this);
  internal::RepeatedPtrFieldBase::
  Destroy<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
            (&(this->extension_range_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Destroy<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
            (&(this->enum_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Destroy<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
            (&(this->nested_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Destroy<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
            (&(this->extension_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Destroy<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
            (&(this->field_).super_RepeatedPtrFieldBase);
  UnknownFieldSet::~UnknownFieldSet(&this->_unknown_fields_);
  Message::~Message(&this->super_Message);
  return;
}

Assistant:

DescriptorProto::~DescriptorProto() {
  SharedDtor();
}